

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O1

bool fs_is_absolute(string_view path)

{
  undefined1 uVar1;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  path local_38;
  
  if (in_RDI == 0) {
    uVar1 = 0;
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_38,&local_48,auto_format);
    uVar1 = std::filesystem::__cxx11::path::has_root_directory();
    std::filesystem::__cxx11::path::~path(&local_38);
  }
  return (bool)uVar1;
}

Assistant:

bool fs_is_absolute(std::string_view path)
{
  if(path.empty())
    return false;

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).is_absolute();
#else
  if(fs_is_windows())
    return path.length() > 2 && !(fs_root_name(path).empty()) && (path[2] == '/' || path[2] == '\\');
  else
    return path.front() == '/';
#endif
}